

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::DepthCase::iterate(DepthCase *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  deUint32 seed;
  int iVar6;
  int iVar7;
  int iVar8;
  RenderContext *context_00;
  undefined4 extraout_var;
  TestLog *log_00;
  char *str;
  float *pfVar9;
  PixelFormat *pPVar10;
  MessageBuilder *pMVar11;
  Enum<int,_2UL> EVar12;
  char *local_6818;
  bool local_6802;
  bool isOk;
  bool imagesOk;
  float threshold;
  Enum<int,_2UL> local_66e8;
  GetNameFunc local_66d8;
  int local_66d0;
  Enum<int,_2UL> local_66c8;
  MessageBuilder local_66b8;
  byte local_6531;
  undefined1 local_6530 [7];
  bool errorCodesOk;
  MultisamplePixelBufferAccess local_6508;
  MultisamplePixelBufferAccess local_64e0;
  ReferenceContextLimits local_64b8;
  undefined1 local_6460 [8];
  ReferenceContext context_1;
  undefined1 local_2a0 [8];
  ReferenceContextBuffers buffers;
  undefined1 local_218 [8];
  GLContext context;
  deUint32 refError;
  deUint32 gles2Error;
  Surface refFrame;
  Surface gles2Frame;
  int y;
  int x;
  int height;
  undefined1 local_50 [4];
  int width;
  Random rnd;
  char *failReason;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  Vec4 clearColor;
  DepthCase *this_local;
  RenderTarget *this_00;
  
  clearColor.m_data._8_8_ = this;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderCtx,0.125,0.25,0.5,1.0);
  context_00 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*context_00->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar5);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)local_50,seed);
  iVar5 = tcu::RenderTarget::getWidth(this_00);
  iVar5 = ::deMin32(iVar5,0x80);
  iVar6 = tcu::RenderTarget::getHeight(this_00);
  iVar6 = ::deMin32(iVar6,0x80);
  iVar7 = tcu::RenderTarget::getWidth(this_00);
  iVar7 = de::Random::getInt((Random *)local_50,0,iVar7 - iVar5);
  iVar8 = tcu::RenderTarget::getHeight(this_00);
  iVar8 = de::Random::getInt((Random *)local_50,0,iVar8 - iVar6);
  tcu::Surface::Surface((Surface *)&refFrame.m_pixels.m_cap,iVar5,iVar6);
  tcu::Surface::Surface((Surface *)&refError,iVar5,iVar6);
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)&buffers.m_stencilbuffer.m_data.m_cap,iVar7,iVar8,iVar5,iVar6);
  sglr::GLContext::GLContext
            ((GLContext *)local_218,context_00,log_00,1,
             (IVec4 *)&buffers.m_stencilbuffer.m_data.m_cap);
  pfVar9 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&renderCtx);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&renderCtx);
  fVar2 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&renderCtx);
  fVar3 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&renderCtx);
  sglr::GLContext::clearColor((GLContext *)local_218,fVar1,fVar2,fVar3,*pfVar9);
  sglr::GLContext::clear((GLContext *)local_218,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,local_218);
  sglr::Context::readPixels
            ((Context *)local_218,(Surface *)&refFrame.m_pixels.m_cap,0,0,iVar5,iVar6);
  context.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       sglr::GLContext::getError((GLContext *)local_218);
  sglr::GLContext::~GLContext((GLContext *)local_218);
  pPVar10 = tcu::RenderTarget::getPixelFormat(this_00);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8,8,8,(uint)(pPVar10->alphaBits != 0) << 3);
  iVar7 = tcu::RenderTarget::getDepthBits(this_00);
  iVar8 = tcu::RenderTarget::getStencilBits(this_00);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)local_2a0,
             (PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,iVar7,iVar8,iVar5,iVar6,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_64b8,context_00);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_64e0,(ReferenceContextBuffers *)local_2a0);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6508,(ReferenceContextBuffers *)local_2a0);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)local_6530,(ReferenceContextBuffers *)local_2a0);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_6460,&local_64b8,&local_64e0,&local_6508,
             (MultisamplePixelBufferAccess *)local_6530);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_64b8);
  pfVar9 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&renderCtx);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&renderCtx);
  fVar2 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&renderCtx);
  fVar3 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&renderCtx);
  sglr::ReferenceContext::clearColor((ReferenceContext *)local_6460,fVar1,fVar2,fVar3,*pfVar9);
  sglr::ReferenceContext::clear((ReferenceContext *)local_6460,0x4500);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,local_6460);
  sglr::Context::readPixels((Context *)local_6460,(Surface *)&refError,0,0,iVar5,iVar6);
  context.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       sglr::ReferenceContext::getError((ReferenceContext *)local_6460);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6460);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers((ReferenceContextBuffers *)local_2a0);
  local_6531 = context.m_programs.
               super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
               (deUint32)
               context.m_programs.
               super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (!(bool)local_6531) {
    tcu::TestLog::operator<<(&local_66b8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_66b8,(char (*) [26])"Error code mismatch: got ");
    EVar12 = glu::getErrorStr(context.m_programs.
                              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_66d8 = EVar12.m_getName;
    local_66d0 = EVar12.m_value;
    local_66c8.m_getName = local_66d8;
    local_66c8.m_value = local_66d0;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_66c8);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])0x2c24a65);
    EVar12 = glu::getErrorStr((deUint32)
                              context.m_programs.
                              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_66e8.m_getName = EVar12.m_getName;
    local_66e8.m_value = EVar12.m_value;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_66e8);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_66b8);
    rnd.m_rnd._8_8_ = anon_var_dwarf_e0dc6f;
  }
  bVar4 = tcu::fuzzyCompare(log_00,"ComparisonResult","Image comparison result",(Surface *)&refError
                            ,(Surface *)&refFrame.m_pixels.m_cap,0.02,COMPARE_LOG_RESULT);
  if ((!bVar4) && (rnd.m_rnd._8_8_ == 0)) {
    rnd.m_rnd._8_8_ = anon_var_dwarf_98f59a;
  }
  local_6802 = false;
  if ((local_6531 & 1) != 0) {
    local_6802 = bVar4;
  }
  if (local_6802 == false) {
    local_6818 = (char *)rnd.m_rnd._8_8_;
  }
  else {
    local_6818 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(local_6802 == false),local_6818);
  tcu::Surface::~Surface((Surface *)&refError);
  tcu::Surface::~Surface((Surface *)&refFrame.m_pixels.m_cap);
  de::Random::~Random((Random *)local_50);
  return STOP;
}

Assistant:

TestCase::IterateResult DepthCase::iterate (void)
{
	tcu::Vec4					clearColor				= tcu::Vec4(0.125f, 0.25f, 0.5f, 1.0f);
	glu::RenderContext&			renderCtx				= m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();
	const char*					failReason				= DE_NULL;

	// Position & size for context
	de::Random rnd(deStringHash(getName()));

	int		width	= deMin32(renderTarget.getWidth(),	128);
	int		height	= deMin32(renderTarget.getHeight(),	128);
	int		x		= rnd.getInt(0, renderTarget.getWidth()		- width);
	int		y		= rnd.getInt(0, renderTarget.getHeight()	- height);

	tcu::Surface	gles2Frame	(width, height);
	tcu::Surface	refFrame	(width, height);
	deUint32		gles2Error;
	deUint32		refError;

	// Render using GLES2
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context); // Call actual render func
		context.readPixels(gles2Frame, 0, 0, width, height);
		gles2Error = context.getError();
	}

	// Render reference image
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		context.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		render(context);
		context.readPixels(refFrame, 0, 0, width, height);
		refError = context.getError();
	}

	// Compare error codes
	bool errorCodesOk = (gles2Error == refError);

	if (!errorCodesOk)
	{
		log << tcu::TestLog::Message << "Error code mismatch: got " << glu::getErrorStr(gles2Error) << ", expected " << glu::getErrorStr(refError) << tcu::TestLog::EndMessage;
		failReason = "Got unexpected error";
	}

	// Compare images
	const float		threshold	= 0.02f;
	bool			imagesOk	= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles2Frame, threshold, tcu::COMPARE_LOG_RESULT);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodesOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}